

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInvalidDataProcess.cpp
# Opt level: O2

bool AllIdentical<aiQuatKey>(aiQuatKey *in,uint num,ai_real epsilon)

{
  aiQuatKey *paVar1;
  bool bVar2;
  long lVar3;
  aiQuaternion *this;
  bool bVar4;
  
  bVar4 = true;
  if (1 < num) {
    lVar3 = (ulong)(num - 1) + 1;
    if (epsilon == 0.0) {
      paVar1 = in + 1;
      do {
        this = &paVar1->mValue;
        lVar3 = lVar3 + -1;
        bVar4 = lVar3 == 0;
        if (bVar4) {
          return bVar4;
        }
        paVar1 = (aiQuatKey *)(this + 1);
        bVar2 = aiQuaterniont<float>::operator!=
                          (this,(aiQuaterniont<float> *)((long)(this + -2) + 8));
      } while (!bVar2);
    }
    else {
      do {
        lVar3 = lVar3 + -1;
        bVar4 = lVar3 == 0;
        if (bVar4) {
          return bVar4;
        }
        bVar2 = EpsilonCompare<aiQuatKey>(in,in + 1,epsilon);
        in = in + 1;
      } while (bVar2);
    }
  }
  return bVar4;
}

Assistant:

inline
bool AllIdentical(T* in, unsigned int num, ai_real epsilon) {
    if (num <= 1) {
        return true;
    }

    if (fabs(epsilon) > 0.f) {
        for (unsigned int i = 0; i < num-1;++i) {
            if (!EpsilonCompare(in[i],in[i+1],epsilon)) {
                return false;
            }
        }
    } else {
        for (unsigned int i = 0; i < num-1;++i) {
            if (in[i] != in[i+1]) {
                return false;
            }
        }
    }
    return true;
}